

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O0

void __thiscall icu_63::UVector::setSize(UVector *this,int32_t newSize,UErrorCode *status)

{
  UBool UVar1;
  UElement empty;
  int32_t i;
  UErrorCode *status_local;
  int32_t newSize_local;
  UVector *this_local;
  
  if (-1 < newSize) {
    if (this->count < newSize) {
      UVar1 = ensureCapacity(this,newSize,status);
      if (UVar1 == '\0') {
        return;
      }
      for (empty._4_4_ = this->count; (int)empty._4_4_ < newSize; empty._4_4_ = empty._4_4_ + 1) {
        this->elements[(int)empty._4_4_].pointer = (void *)0x0;
      }
    }
    else {
      empty._4_4_ = this->count;
      while (empty._4_4_ = empty._4_4_ + -1, newSize <= (int)empty._4_4_) {
        removeElementAt(this,empty._4_4_);
      }
    }
    this->count = newSize;
  }
  return;
}

Assistant:

void UVector::setSize(int32_t newSize, UErrorCode &status) {
    int32_t i;
    if (newSize < 0) {
        return;
    }
    if (newSize > count) {
        if (!ensureCapacity(newSize, status)) {
            return;
        }
        UElement empty;
        empty.pointer = NULL;
        empty.integer = 0;
        for (i=count; i<newSize; ++i) {
            elements[i] = empty;
        }
    } else {
        /* Most efficient to count down */
        for (i=count-1; i>=newSize; --i) {
            removeElementAt(i);
        }
    }
    count = newSize;
}